

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  sqlite3 *psVar1;
  Db *pDVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  psVar1 = pParse->db;
  lVar4 = 8;
  lVar5 = 0;
  do {
    if (psVar1->nDb <= lVar5) {
      return;
    }
    pDVar2 = psVar1->aDb;
    if (*(long *)((long)&pDVar2->zDbSName + lVar4) != 0) {
      if (zDb != (char *)0x0) {
        iVar3 = sqlite3StrICmp(zDb,*(char **)((long)pDVar2 + lVar4 + -8));
        if (iVar3 != 0) goto LAB_0016db3b;
      }
      sqlite3CodeVerifySchema(pParse,(int)lVar5);
    }
LAB_0016db3b:
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}